

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O0

void __thiscall FParser::OPminus(FParser *this,svalue_t *result,int start,int n,int stop)

{
  fsfix fVar1;
  fsfix fVar2;
  int iVar3;
  int iVar4;
  undefined1 local_58 [8];
  svalue_t right;
  svalue_t left;
  int stop_local;
  int n_local;
  int start_local;
  svalue_t *result_local;
  FParser *this_local;
  
  svalue_t::svalue_t((svalue_t *)&right.value);
  svalue_t::svalue_t((svalue_t *)local_58);
  if (start == n) {
    EvaluateExpression(this,(svalue_t *)local_58,n + 1,stop);
  }
  else {
    EvaluateExpression(this,(svalue_t *)&right.value,start,n + -1);
    EvaluateExpression(this,(svalue_t *)local_58,n + 1,stop);
  }
  if ((right.value.i == 6) || (local_58._0_4_ == 6)) {
    result->type = 6;
    fVar1 = fixedvalue((svalue_t *)&right.value);
    fVar2 = fixedvalue((svalue_t *)local_58);
    (result->value).i = fVar1 - fVar2;
  }
  else {
    result->type = 1;
    iVar3 = intvalue((svalue_t *)&right.value);
    iVar4 = intvalue((svalue_t *)local_58);
    (result->value).i = iVar3 - iVar4;
  }
  svalue_t::~svalue_t((svalue_t *)local_58);
  svalue_t::~svalue_t((svalue_t *)&right.value);
  return;
}

Assistant:

void FParser::OPminus(svalue_t &result, int start, int n, int stop)
{
	svalue_t left, right;
	
	// do they mean minus as in '-1' rather than '2-1'?
	if(start == n)
	{
		// kinda hack, hehe
		EvaluateExpression(right, n+1, stop);
	}
	else
	{
		evaluate_leftnright(start, n, stop);
	}
	
	// haleyjd: 8-17
	if(left.type == svt_fixed || right.type == svt_fixed)
	{
		result.type = svt_fixed;
		result.value.f = fixedvalue(left) - fixedvalue(right);
	}
	else
	{
		result.type = svt_int;
		result.value.i = intvalue(left) - intvalue(right);
	}
}